

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionNode.cxx
# Opt level: O2

string * getLinkedTargetsContent<cmLinkItem>
                   (string *__return_storage_ptr__,
                   vector<cmLinkItem,_std::allocator<cmLinkItem>_> *libraries,
                   cmGeneratorTarget *target,cmGeneratorTarget *headTarget,
                   cmGeneratorExpressionContext *context,cmGeneratorExpressionDAGChecker *dagChecker
                   ,string *interfacePropertyName)

{
  pointer pcVar1;
  cmGlobalGenerator *this;
  cmLocalGenerator *lg;
  pointer pcVar2;
  string uniqueName;
  string depString;
  string sep;
  string local_130;
  string local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  local_f0._M_string_length = 0;
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  local_110._M_string_length = 0;
  local_f0.field_2._M_local_buf[0] = '\0';
  local_110.field_2._M_local_buf[0] = '\0';
  pcVar1 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  for (pcVar2 = (libraries->super__Vector_base<cmLinkItem,_std::allocator<cmLinkItem>_>)._M_impl.
                super__Vector_impl_data._M_start; pcVar2 != pcVar1; pcVar2 = pcVar2 + 1) {
    if (pcVar2->Target != target && pcVar2->Target != (cmGeneratorTarget *)0x0) {
      this = cmGeneratorTarget::GetGlobalGenerator(target);
      cmGlobalGenerator::IndexGeneratorTargetUniquely_abi_cxx11_(&local_130,this,pcVar2->Target);
      std::operator+(&local_d0,&local_f0,"$<TARGET_PROPERTY:");
      std::operator+(&local_b0,&local_d0,&local_130);
      std::operator+(&local_90,&local_b0,",");
      std::operator+(&local_70,&local_90,interfacePropertyName);
      std::operator+(&local_50,&local_70,">");
      std::__cxx11::string::append((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::assign((char *)&local_f0);
      std::__cxx11::string::~string((string *)&local_130);
    }
  }
  if (local_110._M_string_length != 0) {
    lg = cmGeneratorTarget::GetLocalGenerator(target);
    cmGeneratorExpressionNode::EvaluateDependentExpression
              (&local_130,&local_110,lg,context,headTarget,target,dagChecker);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_130);
    std::__cxx11::string::~string((string *)&local_130);
  }
  cmGeneratorExpression::StripEmptyListElements(&local_130,__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_130);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  return __return_storage_ptr__;
}

Assistant:

std::string getLinkedTargetsContent(
  std::vector<T> const& libraries, cmGeneratorTarget const* target,
  cmGeneratorTarget const* headTarget, cmGeneratorExpressionContext* context,
  cmGeneratorExpressionDAGChecker* dagChecker,
  const std::string& interfacePropertyName)
{
  std::string linkedTargetsContent;
  std::string sep;
  std::string depString;
  for (T const& l : libraries) {
    // Broken code can have a target in its own link interface.
    // Don't follow such link interface entries so as not to create a
    // self-referencing loop.
    if (l.Target && l.Target != target) {
      std::string uniqueName =
        target->GetGlobalGenerator()->IndexGeneratorTargetUniquely(l.Target);
      depString += sep + "$<TARGET_PROPERTY:" + std::move(uniqueName) + "," +
        interfacePropertyName + ">";
      sep = ";";
    }
  }
  if (!depString.empty()) {
    linkedTargetsContent =
      cmGeneratorExpressionNode::EvaluateDependentExpression(
        depString, target->GetLocalGenerator(), context, headTarget, target,
        dagChecker);
  }
  linkedTargetsContent =
    cmGeneratorExpression::StripEmptyListElements(linkedTargetsContent);
  return linkedTargetsContent;
}